

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void sse::AbsoluteDifference
               (uint32_t rowSizeIn1,uint32_t rowSizeIn2,uint32_t rowSizeOut,uint8_t *in1Y,
               uint8_t *in2Y,uint8_t *outY,uint8_t *outYEnd,uint32_t simdWidth,
               uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint8_t *puVar5;
  uint8_t uVar6;
  long lVar7;
  ulong uVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  
  uVar8 = (ulong)totalSimdWidth;
  puVar9 = in1Y + uVar8;
  puVar10 = in2Y + uVar8;
  puVar5 = outY + uVar8;
  for (; outY != outYEnd; outY = outY + rowSizeOut) {
    for (lVar7 = 0; (ulong)simdWidth << 4 != lVar7; lVar7 = lVar7 + 0x10) {
      auVar4 = vpminub_avx(*(undefined1 (*) [16])(in1Y + lVar7),*(undefined1 (*) [16])(in2Y + lVar7)
                          );
      auVar3 = vpmaxub_avx(*(undefined1 (*) [16])(in1Y + lVar7),*(undefined1 (*) [16])(in2Y + lVar7)
                          );
      auVar3 = vpsubb_avx(auVar3,auVar4);
      *(undefined1 (*) [16])(outY + lVar7) = auVar3;
    }
    if (nonSimdWidth != 0) {
      for (uVar8 = 0; nonSimdWidth != uVar8; uVar8 = uVar8 + 1) {
        bVar1 = puVar9[uVar8];
        bVar2 = puVar10[uVar8];
        uVar6 = -(bVar1 - bVar2);
        if (bVar2 <= bVar1) {
          uVar6 = bVar1 - bVar2;
        }
        puVar5[uVar8] = uVar6;
      }
    }
    in1Y = in1Y + rowSizeIn1;
    in2Y = in2Y + rowSizeIn2;
    puVar9 = puVar9 + rowSizeIn1;
    puVar10 = puVar10 + rowSizeIn2;
    puVar5 = puVar5 + rowSizeOut;
  }
  return;
}

Assistant:

void AbsoluteDifference( uint32_t rowSizeIn1, uint32_t rowSizeIn2, uint32_t rowSizeOut, const uint8_t * in1Y, const uint8_t * in2Y,
                             uint8_t * outY, const uint8_t * outYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSizeIn1, in2Y += rowSizeIn2 ) {
            const simd * src1 = reinterpret_cast <const simd*> (in1Y);
            const simd * src2 = reinterpret_cast <const simd*> (in2Y);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++src2, ++dst ) {
                simd data1 = _mm_loadu_si128( src1 );
                simd data2 = _mm_loadu_si128( src2 );
                _mm_storeu_si128( dst, _mm_sub_epi8( _mm_max_epu8( data1, data2 ), _mm_min_epu8( data1, data2 ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * in1X = in1Y + totalSimdWidth;
                const uint8_t * in2X = in2Y + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++in1X, ++in2X )
                    (*outX) = static_cast<uint8_t>( (*in2X) > (*in1X) ? (*in2X) - (*in1X) : (*in1X) - (*in2X) );
            }
        }
    }